

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O3

void __thiscall
QHttpNetworkConnectionChannel::pipelineInto
          (QHttpNetworkConnectionChannel *this,HttpMessagePair *pair)

{
  QSharedDataPointer<QHttpNetworkRequestPrivate> *this_00;
  QHttpNetworkReply *pQVar1;
  long lVar2;
  int *piVar3;
  ProxyType PVar4;
  undefined8 uVar5;
  QHttpNetworkRequestPrivate *pQVar6;
  long in_FS_OFFSET;
  QByteArray local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = pair->second;
  QHttpNetworkReplyPrivate::clear(*(QHttpNetworkReplyPrivate **)&pQVar1->field_0x8);
  QWeakPointer<QObject>::operator=
            ((QWeakPointer<QObject> *)(*(long *)&pQVar1->field_0x8 + 0x168),
             (QWeakPointer<QObject> *)(this + 0xf0));
  lVar2 = *(long *)&pQVar1->field_0x8;
  uVar5 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
  piVar3 = *(int **)(lVar2 + 0x178);
  *(undefined8 *)(lVar2 + 0x178) = uVar5;
  *(QHttpNetworkConnectionChannel **)(lVar2 + 0x180) = this;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3);
    }
  }
  pQVar6 = (pair->first).d.d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar6->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1) {
    this_00 = &(pair->first).d;
    QSharedDataPointer<QHttpNetworkRequestPrivate>::detach_helper(this_00);
    pQVar6 = (this_00->d).ptr;
  }
  lVar2 = *(long *)&pQVar1->field_0x8;
  *(bool *)(lVar2 + 0x18c) = pQVar6->autoDecompress;
  *(undefined1 *)(lVar2 + 0x1b9) = 1;
  PVar4 = QNetworkProxy::type((QNetworkProxy *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0xc0));
  QHttpNetworkRequestPrivate::header(&local_40,&pair->first,PVar4 != NoProxy);
  QByteArray::append((QByteArray *)(this + 0xd0));
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,0x10);
    }
  }
  QtPrivate::QGenericArrayOps<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
  emplace<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>const&>
            ((QGenericArrayOps<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *)(this + 0xb8),
             *(qsizetype *)(this + 200),pair);
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end
            ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)(this + 0xb8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::pipelineInto(HttpMessagePair &pair)
{
    // this is only called for simple GET

    QHttpNetworkRequest &request = pair.first;
    QHttpNetworkReply *reply = pair.second;
    reply->d_func()->clear();
    reply->d_func()->connection = connection;
    reply->d_func()->connectionChannel = this;
    reply->d_func()->autoDecompress = request.d->autoDecompress;
    reply->d_func()->pipeliningUsed = true;

#ifndef QT_NO_NETWORKPROXY
    pipeline.append(QHttpNetworkRequestPrivate::header(request,
                                                           (connection->d_func()->networkProxy.type() != QNetworkProxy::NoProxy)));
#else
    pipeline.append(QHttpNetworkRequestPrivate::header(request, false));
#endif

    alreadyPipelinedRequests.append(pair);

    // pipelineFlush() needs to be called at some point afterwards
}